

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

int Llb_ManComputeBestQuant(Llb_Mtr_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar4 = (long)p->nCols + -1;
  uVar3 = 0xffffffff;
  iVar5 = -100000;
  lVar8 = 2;
  for (lVar6 = 1; lVar6 < lVar4; lVar6 = lVar6 + 1) {
    for (lVar7 = lVar8; lVar7 < lVar4; lVar7 = lVar7 + 1) {
      iVar2 = p->pColSums[lVar6];
      if ((((iVar2 != 0) && (iVar1 = p->pMan->pPars->nClusterMax, iVar2 <= iVar1)) &&
          (iVar2 = p->pColSums[lVar7], iVar2 != 0)) && (iVar2 <= iVar1)) {
        iVar2 = Llb_ManComputeCommonQuant(p,(int)lVar6,(uint)lVar7);
        if (0 < iVar2 && iVar5 < iVar2) {
          iVar5 = iVar2;
          uVar3 = (int)lVar6 << 0x10 | (uint)lVar7;
        }
      }
    }
    lVar8 = lVar8 + 1;
  }
  return uVar3;
}

Assistant:

int Llb_ManComputeBestQuant( Llb_Mtr_t * p )
{
    int i, k, WeightBest = -100000, WeightCur, RetValue = -1;
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
    {
        if ( p->pColSums[i] == 0 || p->pColSums[i] > p->pMan->pPars->nClusterMax )
            continue;
        if ( p->pColSums[k] == 0 || p->pColSums[k] > p->pMan->pPars->nClusterMax )
            continue;

        WeightCur = Llb_ManComputeCommonQuant( p, i, k );
        if ( WeightCur <= 0 )
            continue;
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            RetValue   = (i << 16) | k;
        }
    }
//    printf( "Choosing best quant Weight %4d\n", WeightCur );
    return RetValue;
}